

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::VertexIDCase::~VertexIDCase(VertexIDCase *this)

{
  ~VertexIDCase(this);
  operator_delete(this,200);
  return;
}

Assistant:

VertexIDCase::~VertexIDCase (void)
{
	VertexIDCase::deinit();
}